

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape.cpp
# Opt level: O2

int __thiscall
ncnn::Reshape::eval_shape_expr
          (Reshape *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,int *outw,
          int *outh,int *outd,int *outc)

{
  int iVar1;
  pointer piVar2;
  long lVar3;
  long lVar4;
  int *piVar5;
  int *piVar6;
  vector<int,_std::allocator<int>_> shape;
  
  shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar1 = eval_list_expression(&this->shape_expr,bottom_blobs,&shape);
  if (iVar1 != 0) {
    iVar1 = -1;
    goto switchD_00309359_default;
  }
  *outw = 1;
  *outh = 1;
  *outd = 1;
  *outc = 1;
  lVar4 = 4;
  piVar2 = shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  iVar1 = 0;
  switch((long)shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish -
         (long)shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start >> 2) {
  case 1:
    goto switchD_00309359_caseD_1;
  case 2:
    outc = outh;
    piVar5 = shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    goto LAB_00309391;
  case 3:
    lVar3 = lVar4;
    lVar4 = 8;
    piVar5 = shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar6 = outw;
    outw = outh;
    break;
  case 4:
    *outw = *shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    lVar3 = 8;
    lVar4 = 0xc;
    piVar5 = shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start + 1;
    piVar6 = outh;
    outw = outd;
    break;
  default:
    goto switchD_00309359_default;
  }
  *piVar6 = *piVar5;
  piVar5 = (int *)(lVar3 + (long)shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
LAB_00309391:
  *outw = *piVar5;
  piVar2 = (pointer)((long)shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar4);
  outw = outc;
switchD_00309359_caseD_1:
  *outw = *piVar2;
  iVar1 = 0;
switchD_00309359_default:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&shape.super__Vector_base<int,_std::allocator<int>_>);
  return iVar1;
}

Assistant:

int Reshape::eval_shape_expr(const std::vector<Mat>& bottom_blobs, int& outw, int& outh, int& outd, int& outc) const
{
    // [size(@0,0),size(@0,1),12,64]
    std::vector<int> shape;
    int er = eval_list_expression(shape_expr, bottom_blobs, shape);
    if (er != 0)
        return -1;

    outw = 1;
    outh = 1;
    outd = 1;
    outc = 1;
    if (shape.size() == 1)
    {
        outw = shape[0];
    }
    if (shape.size() == 2)
    {
        outw = shape[0];
        outh = shape[1];
    }
    if (shape.size() == 3)
    {
        outw = shape[0];
        outh = shape[1];
        outc = shape[2];
    }
    if (shape.size() == 4)
    {
        outw = shape[0];
        outh = shape[1];
        outd = shape[2];
        outc = shape[3];
    }

    return 0;
}